

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O3

void aom_noise_tx_inverse(aom_noise_tx_t *noise_tx,float *data)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = noise_tx->block_size;
  (*noise_tx->ifft)(noise_tx->tx_block,noise_tx->temp,data);
  if (iVar2 != 0) {
    iVar2 = iVar2 * iVar2;
    uVar1 = 0;
    do {
      data[uVar1] = data[uVar1] / (float)iVar2;
      uVar1 = uVar1 + 1;
    } while (iVar2 + (uint)(iVar2 == 0) != uVar1);
  }
  return;
}

Assistant:

void aom_noise_tx_inverse(struct aom_noise_tx_t *noise_tx, float *data) {
  const int n = noise_tx->block_size * noise_tx->block_size;
  noise_tx->ifft(noise_tx->tx_block, noise_tx->temp, data);
  for (int i = 0; i < n; ++i) {
    data[i] /= n;
  }
}